

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

int main(void)

{
  pointer puVar1;
  Header *header;
  MCU *mcus;
  long lVar2;
  long *plVar3;
  Header *pHVar4;
  int iVar5;
  ulong uVar6;
  string outFileName;
  string filename;
  Header *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  long *local_a8;
  pointer local_a0;
  long local_98 [2];
  string local_88;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/Cheemion[P]JPEG_COMPRESS/resource/lina.jpg"
             ,"");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_a8,local_a0 + (long)local_a8);
  header = readJPG(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  iVar5 = -1;
  if (header == (Header *)0x0) goto LAB_001057f0;
  if (header->valid == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    puVar1 = (header->huffmanData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)(header->huffmanData).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1
                     );
    }
    operator_delete(header,0x1e70);
    goto LAB_001057f0;
  }
  printHeader(header);
  mcus = decodeHuffmanData(header);
  if (mcus == (MCU *)0x0) {
    puVar1 = (header->huffmanData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)(header->huffmanData).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1
                     );
    }
    uVar6 = 0x1e70;
LAB_001057e9:
    operator_delete(header,uVar6);
  }
  else {
    dequantize(header,mcus);
    inverseDCT(header,mcus);
    YCbCrToRGB(header,mcus);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    lVar2 = std::__cxx11::string::rfind((char)&local_a8,0x2e);
    if (lVar2 == -1) {
      local_c8 = (Header *)local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_a8,local_a0 + (long)local_a8);
      std::__cxx11::string::append((char *)&local_c8);
    }
    else {
      std::__cxx11::string::substr((ulong)local_48,(ulong)&local_a8);
      plVar3 = (long *)std::__cxx11::string::append((char *)local_48);
      local_c8 = (Header *)local_b8;
      pHVar4 = (Header *)(plVar3 + 2);
      if ((Header *)*plVar3 == pHVar4) {
        local_b8[0] = pHVar4->startOfSelection;
        local_b8[1] = pHVar4->endOfSelection;
        local_b8[2] = pHVar4->successiveApproximationHigh;
        local_b8[3] = pHVar4->successiveApproximationLow;
        local_b8._4_4_ = *(undefined4 *)&pHVar4->field_0x4;
        local_b8._8_8_ = plVar3[3];
      }
      else {
        local_b8[0] = pHVar4->startOfSelection;
        local_b8[1] = pHVar4->endOfSelection;
        local_b8[2] = pHVar4->successiveApproximationHigh;
        local_b8[3] = pHVar4->successiveApproximationLow;
        local_b8._4_4_ = *(undefined4 *)&pHVar4->field_0x4;
        local_c8 = (Header *)*plVar3;
      }
      local_c0 = plVar3[1];
      *plVar3 = (long)pHVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_c8,local_c8->huffmanDCTables[0].offsets + local_c0 + -0x20)
    ;
    writeBMP(header,mcus,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    operator_delete__(mcus);
    puVar1 = (header->huffmanData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)(header->huffmanData).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1
                     );
    }
    operator_delete(header,0x1e70);
    if (local_c8 != (Header *)local_b8) {
      uVar6 = local_b8._0_8_ + 1;
      header = local_c8;
      goto LAB_001057e9;
    }
  }
  iVar5 = 0;
LAB_001057f0:
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return iVar5;
}

Assistant:

int main() {
	
	//jpeg file path
	const std::string filename(EXAMPLE_PATH_JPG);

	Header* header = readJPG(filename);
	if (header == nullptr) {
		return -1;
	}

	if (header->valid == false) {
		std::cout << "Error" << std::endl;
		delete header;
		return -1;
	}

	printHeader(header);


	//decode huffman data
	MCU* mcus = decodeHuffmanData(header);
	//write BMP file
	if (mcus == nullptr)
	{	
		delete header;
		return 0;
	}

	dequantize(header, mcus);

	inverseDCT(header, mcus);

	YCbCrToRGB(header, mcus);

	std::cout << "done" << std::endl;
	// write BMP file
	const std::size_t pos = filename.find_last_of('.');
	const std::string outFileName = (pos == std::string::npos) ? (filename + ".") : (filename.substr(0, pos) + ".bmp");
	writeBMP(header, mcus, outFileName);
	delete[] mcus;
	delete header;

	return 0;
}